

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::composeQuickCheck
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,
          UNormalizationCheckResult *pQCResult)

{
  UChar UVar1;
  UChar UVar2;
  UChar UVar3;
  void *pvVar4;
  UBool UVar5;
  uint uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  UCPTrie *pUVar10;
  byte bVar11;
  UChar *pUVar12;
  UChar *pUVar13;
  UChar *pUVar14;
  long lVar15;
  bool bVar16;
  
  UVar1 = this->minCompNoMaybeCP;
  pUVar13 = src;
  if (limit == (UChar *)0x0) {
    lVar15 = 2;
    pUVar14 = src + -2;
    do {
      pUVar12 = pUVar14;
      pUVar14 = pUVar12 + 1;
      lVar15 = lVar15 + -2;
      if (pUVar12[2] == L'\0') break;
    } while ((ushort)pUVar12[2] < (ushort)UVar1);
    pUVar12 = pUVar12 + 2;
    limit = u_strchr_63(pUVar12,L'\0');
    if ((lVar15 != 0) &&
       (UVar5 = hasCompBoundaryAfter(this,(uint)(ushort)*pUVar14,onlyContiguous), src = pUVar12,
       pUVar13 = pUVar12, UVar5 == '\0')) {
      src = pUVar14;
      pUVar13 = pUVar14;
    }
  }
LAB_003199de:
  if (pUVar13 == limit) {
    return pUVar13;
  }
  do {
    UVar2 = *pUVar13;
    if ((ushort)UVar2 < (ushort)UVar1) {
LAB_00319a1e:
      pUVar14 = pUVar13 + 1;
    }
    else {
      pUVar10 = this->normTrie;
      pvVar4 = (pUVar10->data).ptr0;
      uVar8 = *(ushort *)
               ((long)pvVar4 +
               (ulong)(((ushort)UVar2 & 0x3f) + (uint)pUVar10->index[(ushort)UVar2 >> 6]) * 2);
      uVar7 = this->minNoNo;
      if (uVar8 < uVar7) goto LAB_00319a1e;
      pUVar14 = pUVar13 + 1;
      if (((ushort)UVar2 & 0xfc00) != 0xd800) break;
      if ((pUVar14 != limit) && ((*pUVar14 & 0xfc00U) == 0xdc00)) {
        iVar9 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)*pUVar14 + -0x35fdc00;
        if (iVar9 < pUVar10->highStart) {
          iVar9 = ucptrie_internalSmallIndex_63(pUVar10,iVar9);
          uVar7 = this->minNoNo;
        }
        else {
          iVar9 = pUVar10->dataLength + -2;
        }
        pUVar14 = pUVar13 + 2;
        uVar8 = *(ushort *)((long)pvVar4 + (long)iVar9 * 2);
        if (uVar7 <= uVar8) break;
      }
    }
    pUVar13 = pUVar14;
    if (pUVar13 == limit) {
      return pUVar13;
    }
  } while( true );
  uVar6 = 1;
  pUVar12 = src;
  if (((src == pUVar13) || (pUVar12 = pUVar13, uVar8 < this->minNoNoCompNoMaybeCC)) ||
     ((this->limitNoNo <= uVar8 && (uVar8 < this->minMaybeYes)))) goto LAB_00319bc9;
  pUVar12 = pUVar13 + -1;
  UVar2 = pUVar13[-1];
  if ((UVar2 & 0xf800U) == 0xd800) {
    if ((((ushort)UVar2 >> 10 & 1) == 0) || (pUVar12 == src)) {
      pUVar10 = this->normTrie;
    }
    else {
      pUVar10 = this->normTrie;
      if ((pUVar13[-2] & 0xfc00U) == 0xd800) {
        pUVar12 = pUVar13 + -2;
        iVar9 = (uint)(ushort)UVar2 + (uint)(ushort)pUVar13[-2] * 0x400 + -0x35fdc00;
        if (iVar9 < pUVar10->highStart) {
          iVar9 = ucptrie_internalSmallIndex_63(pUVar10,iVar9);
          pUVar10 = this->normTrie;
        }
        else {
          iVar9 = pUVar10->dataLength + -2;
        }
        goto LAB_00319b72;
      }
    }
    iVar9 = pUVar10->dataLength + -1;
  }
  else {
    pUVar10 = this->normTrie;
    iVar9 = ((ushort)UVar2 & 0x3f) + (uint)pUVar10->index[(ushort)UVar2 >> 6];
  }
LAB_00319b72:
  uVar7 = *(ushort *)((long)(pUVar10->data).ptr0 + (long)iVar9 * 2);
  bVar16 = (uVar7 & 1) == 0;
  uVar6 = (uint)uVar7;
  if (onlyContiguous != '\0' && !bVar16) {
    bVar16 = true;
    if (uVar6 != 1) {
      if (uVar7 < this->limitNoNo) {
        bVar16 = *(ushort *)((long)this->extraData + (ulong)(uVar6 & 0xfffffffe)) < 0x200;
      }
      else {
        bVar16 = (uVar7 & 6) < 3;
      }
    }
    bVar16 = (bool)(bVar16 ^ 1);
  }
  if (!bVar16) {
    uVar6 = 1;
    pUVar12 = pUVar13;
  }
LAB_00319bc9:
  if (uVar8 < this->minMaybeYes) goto LAB_00319d2e;
  uVar7 = uVar8 >> 1;
  if (uVar8 < 0xfc00) {
    uVar7 = 0;
  }
  if ((((onlyContiguous != '\0') && ((byte)uVar7 != 0)) && (this->minYesNo < (ushort)uVar6)) &&
     ((byte)uVar7 < *(byte *)((long)this->extraData + (ulong)(uVar6 & 0xfffe) + 1)))
  goto LAB_00319d2e;
  do {
    src = pUVar14;
    if (uVar8 < 0xfe02) {
      if (pQCResult == (UNormalizationCheckResult *)0x0) {
        return pUVar12;
      }
      *pQCResult = UNORM_MAYBE;
    }
    if (src == limit) {
      return src;
    }
    pUVar14 = src + 1;
    UVar2 = *src;
    if ((UVar2 & 0xf800U) == 0xd800) {
      if ((((ushort)UVar2 >> 10 & 1) == 0) && (pUVar14 != limit)) {
        UVar3 = *pUVar14;
        pUVar10 = this->normTrie;
        if ((UVar3 & 0xfc00U) == 0xdc00) {
          pUVar14 = src + 2;
          iVar9 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar3 + -0x35fdc00;
          if (iVar9 < pUVar10->highStart) {
            iVar9 = ucptrie_internalSmallIndex_63(pUVar10,iVar9);
            pUVar10 = this->normTrie;
          }
          else {
            iVar9 = pUVar10->dataLength + -2;
          }
          goto LAB_00319cd0;
        }
      }
      else {
        pUVar10 = this->normTrie;
      }
      iVar9 = pUVar10->dataLength + -1;
    }
    else {
      pUVar10 = this->normTrie;
      iVar9 = ((ushort)UVar2 & 0x3f) + (uint)pUVar10->index[(ushort)UVar2 >> 6];
    }
LAB_00319cd0:
    bVar11 = (byte)uVar7;
    uVar8 = *(ushort *)((long)(pUVar10->data).ptr0 + (long)iVar9 * 2);
    if (uVar8 < this->minMaybeYes) break;
    if (uVar8 < 0xfc00) {
      uVar7 = 0;
    }
    else {
      uVar7 = uVar8 >> 1;
    }
  } while ((byte)uVar7 == 0 || bVar11 <= (byte)uVar7);
  pUVar13 = pUVar14;
  if (this->minNoNo <= uVar8) {
LAB_00319d2e:
    if (pQCResult != (UNormalizationCheckResult *)0x0) {
      *pQCResult = UNORM_NO;
    }
    return pUVar12;
  }
  goto LAB_003199de;
}

Assistant:

const UChar *
Normalizer2Impl::composeQuickCheck(const UChar *src, const UChar *limit,
                                   UBool onlyContiguous,
                                   UNormalizationCheckResult *pQCResult) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        UErrorCode errorCode=U_ZERO_ERROR;
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP, NULL, errorCode);
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                prevBoundary = --src;
            }
        }
    }

    for(;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if(src==limit) {
                return src;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        uint16_t prevNorm16 = INERT;
        if (prevBoundary != prevSrc) {
            if (norm16HasCompBoundaryBefore(norm16)) {
                prevBoundary = prevSrc;
            } else {
                const UChar *p = prevSrc;
                uint16_t n16;
                UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, n16);
                if (norm16HasCompBoundaryAfter(n16, onlyContiguous)) {
                    prevBoundary = prevSrc;
                } else {
                    prevBoundary = p;
                    prevNorm16 = n16;
                }
            }
        }

        if(isMaybeOrNonZeroCC(norm16)) {
            uint8_t cc=getCCFromYesOrMaybe(norm16);
            if (onlyContiguous /* FCC */ && cc != 0 &&
                    getTrailCCFromCompYesAndZeroCC(prevNorm16) > cc) {
                // The [prevBoundary..prevSrc[ character
                // passed the quick check "yes && ccc==0" test
                // but is out of canonical order with the current combining mark.
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                for (;;) {
                    if (norm16 < MIN_YES_YES_WITH_CC) {
                        if (pQCResult != nullptr) {
                            *pQCResult = UNORM_MAYBE;
                        } else {
                            return prevBoundary;
                        }
                    }
                    if (src == limit) {
                        return src;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, norm16);
                    if (isMaybeOrNonZeroCC(norm16)) {
                        cc = getCCFromYesOrMaybe(norm16);
                        if (!(prevCC <= cc || cc == 0)) {
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                if (isCompYesAndZeroCC(norm16)) {
                    prevBoundary = src;
                    src = nextSrc;
                    continue;
                }
            }
        }
        if(pQCResult!=NULL) {
            *pQCResult=UNORM_NO;
        }
        return prevBoundary;
    }
}